

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_SpawnMissileXYZ
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  VMValue *pVVar2;
  bool bVar3;
  bool local_ac;
  bool local_a9;
  MetaClass *local_a8;
  bool local_9b;
  TVector3<double> local_98;
  AActor *local_80;
  AActor *state;
  AActor *owner;
  PClassActor *pPStack_68;
  bool check;
  MetaClass *type;
  AActor *dest;
  double z;
  double y;
  double x;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1962,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1962,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  x = (param->field_0).f;
  local_9b = true;
  if ((DObject *)x != (DObject *)0x0) {
    local_9b = DObject::IsKindOf((DObject *)x,AActor::RegistrationInfo.MyClass);
  }
  if (local_9b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1962,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  iVar1 = (int)self + 1;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1963,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1963,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  y = (double)defaultparam_local[iVar1].Array;
  iVar1 = (int)self + 2;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1964,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1964,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  z = (double)defaultparam_local[iVar1].Array;
  iVar1 = (int)self + 3;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1965,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1965,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  dest = (AActor *)defaultparam_local[iVar1].Array;
  self._0_4_ = (int)self + 4;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1966,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((char)defaultparam_local[(int)self].Count == '\x03') &&
     (bVar3 = true, defaultparam_local[(int)self].Most != 1)) {
    bVar3 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1966,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (defaultparam_local[(int)self].Array == (VMValue *)0x0) {
    NullParam("\"dest\"");
    local_a8 = (MetaClass *)defaultparam_local[(int)self].Array;
  }
  else {
    local_a8 = (MetaClass *)defaultparam_local[(int)self].Array;
  }
  type = local_a8;
  local_a9 = true;
  if (local_a8 != (MetaClass *)0x0) {
    local_a9 = DObject::IsKindOf((DObject *)local_a8,AActor::RegistrationInfo.MyClass);
  }
  if (local_a9 == false) {
    __assert_fail("dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1966,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self._0_4_ = (int)self + 1;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1967,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((char)defaultparam_local[(int)self].Count == '\x03') &&
     (bVar3 = true, defaultparam_local[(int)self].Most != 1)) {
    bVar3 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
  }
  if (bVar3) {
    pPStack_68 = (PClassActor *)defaultparam_local[(int)self].Array;
    local_ac = true;
    if (pPStack_68 != (PClassActor *)0x0) {
      local_ac = PClass::IsDescendantOf((PClass *)pPStack_68,AActor::RegistrationInfo.MyClass);
    }
    if (local_ac == false) {
      __assert_fail("type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1967,
                    "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    self._0_4_ = (int)self + 1;
    if ((int)self < ret_local._4_4_) {
      if ((char)defaultparam_local[(int)self].Count != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1968,
                      "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar1 = *(int *)&defaultparam_local[(int)self].Array;
    }
    else {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1968,
                      "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
      iVar1 = (pVVar2->field_0).i;
    }
    owner._7_1_ = iVar1 != 0;
    self._0_4_ = (int)self + 1;
    if ((int)self < ret_local._4_4_) {
      bVar3 = false;
      if (((char)defaultparam_local[(int)self].Count == '\x03') &&
         (bVar3 = true, defaultparam_local[(int)self].Most != 1)) {
        bVar3 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
      }
      if (!bVar3) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1969,
                      "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      state = (AActor *)defaultparam_local[(int)self].Array;
    }
    else {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
      bVar3 = false;
      if ((pVVar2->field_0).field_3.Type == '\x03') {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        bVar3 = true;
        if ((pVVar2->field_0).field_1.atag != 1) {
          pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
          bVar3 = (pVVar2->field_0).field_1.a == (void *)0x0;
        }
      }
      if (!bVar3) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1969,
                      "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
      state = (AActor *)(pVVar2->field_0).field_1.a;
    }
    TVector3<double>::TVector3(&local_98,y,z,(double)dest);
    local_80 = P_SpawnMissileXYZ(&local_98,(AActor *)x,(AActor *)type,pPStack_68,
                                 (bool)(owner._7_1_ & 1),state);
    if (self._4_4_ < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (_paramnum == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x196a,
                      "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetPointer(_paramnum,local_80,1);
      param_local._4_4_ = 1;
    }
    return param_local._4_4_;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1967,
                "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissileXYZ)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	PARAM_BOOL_DEF(check);
	PARAM_OBJECT_DEF(owner, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissileXYZ(DVector3(x,y,z), self, dest, type, check, owner));
}